

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

int AF_AActor_LineAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  void *pvVar1;
  double distance;
  void *pvVar2;
  int iVar3;
  FTranslatedLineTarget *victim;
  VMReturn *pVVar4;
  bool bVar5;
  PClassActor *pufftype;
  AActor *pAVar6;
  int iVar7;
  char *pcVar8;
  int flags;
  int acdmg;
  VMReturn *local_50;
  FName local_44;
  DAngle local_40;
  DAngle local_38;
  
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_0041e6d6;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0041e69b:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0041e6d6:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11db,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar6 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar6 == (AActor *)0x0) goto LAB_0041e443;
    bVar5 = DObject::IsKindOf((DObject *)pAVar6,AActor::RegistrationInfo.MyClass);
    if (!bVar5) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0041e6d6;
    }
  }
  else {
    if (pAVar6 != (AActor *)0x0) goto LAB_0041e69b;
LAB_0041e443:
    pAVar6 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar8 = "(paramnum) < numparam";
LAB_0041e6fe:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11dc,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar8 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_0041e6fe;
  }
  if ((uint)numparam < 3) {
    pcVar8 = "(paramnum) < numparam";
LAB_0041e726:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11dd,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar8 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_0041e726;
  }
  if (numparam == 3) {
    pcVar8 = "(paramnum) < numparam";
LAB_0041e74e:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11de,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    pcVar8 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_0041e74e;
  }
  if ((uint)numparam < 5) {
    pcVar8 = "(paramnum) < numparam";
LAB_0041e776:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11df,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_0041e776;
  }
  if (numparam == 5) {
    pcVar8 = "(paramnum) < numparam";
LAB_0041e79e:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11e0,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[5].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_0041e79e;
  }
  if ((uint)numparam < 7) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_0041e7ee;
  }
  if (param[6].field_0.field_3.Type != '\x03') {
LAB_0041e6a4:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0041e7ee:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11e1,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pvVar1 = param[1].field_0.field_1.a;
  distance = param[2].field_0.f;
  pvVar2 = param[3].field_0.field_1.a;
  iVar7 = param[4].field_0.i;
  iVar3 = param[5].field_0.i;
  pufftype = (PClassActor *)param[6].field_0.field_1.a;
  local_50 = ret;
  if (param[6].field_0.field_1.atag == 1) {
    if (pufftype == (PClassActor *)0x0) goto LAB_0041e55b;
    bVar5 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)pufftype);
    if (!bVar5) {
      pcVar8 = "puffType == NULL || puffType->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_0041e7ee;
    }
    bVar5 = false;
  }
  else {
    if (pufftype != (PClassActor *)0x0) goto LAB_0041e6a4;
LAB_0041e55b:
    bVar5 = true;
    pufftype = (PClassActor *)0x0;
  }
  if (numparam == 7) {
    param = defaultparam->Array;
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0041e7cf:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x11e2,
                    "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    flags = param[7].field_0.i;
  }
  else {
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_0041e7cf;
    }
    flags = param[7].field_0.i;
    if (8 < (uint)numparam) {
      if ((param[8].field_0.field_3.Type != '\x03') || (param[8].field_0.field_1.atag != 0)) {
        pcVar8 = "(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC";
        goto LAB_0041e6b7;
      }
      goto LAB_0041e5d4;
    }
    param = defaultparam->Array;
  }
  if ((param[8].field_0.field_3.Type != '\x03') || (param[8].field_0.field_1.atag != 0)) {
    pcVar8 = 
    "(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
    ;
LAB_0041e6b7:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11e3,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_0041e5d4:
  victim = (FTranslatedLineTarget *)param[8].field_0.field_1.a;
  if (bVar5) {
    pufftype = PClass::FindActor("BulletPuff");
  }
  local_44.Index = iVar3;
  local_40.Degrees = (double)pvVar2;
  local_38.Degrees = (double)pvVar1;
  pAVar6 = P_LineAttack(pAVar6,&local_38,distance,&local_40,iVar7,&local_44,pufftype,flags,victim,
                        &acdmg);
  pVVar4 = local_50;
  iVar7 = numret;
  if (0 < numret) {
    iVar7 = 1;
    VMReturn::SetPointer(local_50,pAVar6,1);
    if (numret != 1) {
      VMReturn::SetInt(pVVar4 + 1,acdmg);
      iVar7 = 2;
    }
  }
  return iVar7;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, LineAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE(angle);
	PARAM_FLOAT(distance);
	PARAM_ANGLE(pitch);
	PARAM_INT(damage);
	PARAM_NAME(damageType);
	PARAM_CLASS(puffType, AActor);
	PARAM_INT_DEF(flags);
	PARAM_POINTER_DEF(victim, FTranslatedLineTarget);

	int acdmg;
	if (puffType == nullptr) puffType = PClass::FindActor("BulletPuff");	// P_LineAttack does not work without a puff to take info from.
	auto puff = P_LineAttack(self, angle, distance, pitch, damage, damageType, puffType, flags, victim, &acdmg);
	if (numret > 0) ret[0].SetPointer(puff, ATAG_OBJECT);
	if (numret > 1) ret[1].SetInt(acdmg), numret = 2;
	return numret;
}